

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# callback.h
# Opt level: O3

void __thiscall
google::protobuf::internal::
MethodClosure1<google::protobuf::(anonymous_namespace)::ClosureTest,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::Run(MethodClosure1<google::protobuf::(anonymous_namespace)::ClosureTest,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      *this)

{
  bool bVar1;
  pointer pcVar2;
  code *pcVar3;
  long *plVar4;
  long *local_50 [2];
  long local_40 [2];
  
  pcVar3 = (code *)this->method_;
  plVar4 = (long *)((long)&(this->object_->super_Test)._vptr_Test + *(long *)&this->field_0x18);
  if (((ulong)pcVar3 & 1) != 0) {
    pcVar3 = *(code **)(pcVar3 + *plVar4 + -1);
  }
  bVar1 = this->self_deleting_;
  pcVar2 = (this->arg1_)._M_dataplus._M_p;
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_50,pcVar2,pcVar2 + (this->arg1_)._M_string_length);
  (*pcVar3)(plVar4,(string *)local_50);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  if (bVar1 != false) {
    (*(this->super_Closure)._vptr_Closure[1])(this);
  }
  return;
}

Assistant:

void Run() override {
    bool needs_delete = self_deleting_;  // read in case callback deletes
    (object_->*method_)(arg1_);
    if (needs_delete) delete this;
  }